

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::parseNumber(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  _Optional_payload_base<char> _Var1;
  _Optional_base<char,_true,_true> _Var2;
  uint uVar3;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  *this_00;
  double dVar4;
  double local_c0;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_b0;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_88;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_60;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_38;
  
  _Var1._M_engaged = false;
  _Var1._M_payload._M_value = c;
  local_c0 = 0.0;
  do {
    uVar3 = (int)_Var1._M_payload._M_value - 0x30;
    if (9 < uVar3) {
      if (_Var1._M_payload._M_value != '.') goto LAB_00106d33;
      _Var2._M_payload.super__Optional_payload_base<char> =
           (_Optional_payload<char,_true,_true,_true>)next(this);
      if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
        this_00 = &local_60;
        goto LAB_00106d38;
      }
      dVar4 = 0.1;
      goto LAB_00106cec;
    }
    local_c0 = (double)(int)uVar3 + local_c0 * 10.0;
    _Var1 = (_Optional_payload_base<char>)next(this);
  } while (((ushort)_Var1 >> 8 & 1) != 0);
  this_00 = &local_38;
LAB_00106d38:
  *(double *)&this_00->_M_u = local_c0;
  this_00->_M_index = '\x01';
  __return_storage_ptr__->type = Number;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&__return_storage_ptr__->value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)this_00);
  std::__detail::__variant::
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~_Variant_storage(this_00);
  return __return_storage_ptr__;
LAB_00106cec:
  uVar3 = (int)_Var2._M_payload.super__Optional_payload_base<char>._M_payload - 0x30;
  if (9 < uVar3) goto LAB_00106d33;
  local_c0 = local_c0 + (double)(int)uVar3 * dVar4;
  _Var2._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    this_00 = &local_88;
    goto LAB_00106d38;
  }
  dVar4 = dVar4 * 0.1;
  goto LAB_00106cec;
LAB_00106d33:
  this_00 = &local_b0;
  goto LAB_00106d38;
}

Assistant:

Token Tokenizer::parseNumber(char c) {
    optional<char> _;
    double res = 0;
    while (isdigit(c)) {
        res *= 10;
        res += c - '0';

        _ = next();
        if (!_.has_value()) {
            return Token(Number, res);
        }
        c = _.value();
    }
    if (c == '.') {
        double mult = 0.1;
        _ = next();
        if (!_.has_value()) {
            return Token(Number, res);
        }
        c = _.value();
        while (isdigit(c)) {
            res += (c - '0') * mult;
            mult *= 0.1;
            _ = next();
            if (!_.has_value()) {
                return Token(Number, res);
            }
            c = _.value();
        }
    }
    return Token(Number, res);
}